

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVariableManagerVk.cpp
# Opt level: O3

IDeviceObject * __thiscall
Diligent::ShaderVariableManagerVk::Get
          (ShaderVariableManagerVk *this,Uint32 ArrayIndex,Uint32 ResIndex)

{
  PipelineResourceDesc *pPVar1;
  ResourceAttribs *pRVar2;
  DescriptorSet *this_00;
  Resource *pRVar3;
  char (*in_RCX) [31];
  Uint32 UVar4;
  uint Index;
  ShaderResourceCacheType *this_01;
  string msg;
  string local_48;
  
  pPVar1 = GetResourceDesc(this,ResIndex);
  pRVar2 = GetResourceAttribs(this,ResIndex);
  this_01 = (this->
            super_ShaderVariableManagerBase<Diligent::EngineVkImplTraits,_Diligent::ShaderVariableVkImpl>
            ).m_ResourceCache;
  UVar4 = (&pRVar2->SRBCacheOffset)[~*(uint *)&this_01->field_0x1c >> 0x1f];
  if (pPVar1->ArraySize <= ArrayIndex) {
    FormatString<char[26],char[31]>
              (&local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"ArrayIndex < ResDesc.ArraySize",in_RCX);
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"Get",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVariableManagerVk.cpp"
               ,0x293);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    this_01 = (this->
              super_ShaderVariableManagerBase<Diligent::EngineVkImplTraits,_Diligent::ShaderVariableVkImpl>
              ).m_ResourceCache;
  }
  Index = (uint)((ulong)*(undefined8 *)pRVar2 >> 0x3e) & 1;
  if (Index < this_01->m_NumSets) {
    this_00 = ShaderResourceCacheVk::GetDescriptorSet(this_01,Index);
    UVar4 = UVar4 + ArrayIndex;
    if (UVar4 < this_00->m_NumResources) {
      pRVar3 = ShaderResourceCacheVk::DescriptorSet::GetResource(this_00,UVar4);
      return (pRVar3->pObject).m_pObject;
    }
  }
  return (IDeviceObject *)0x0;
}

Assistant:

IDeviceObject* ShaderVariableManagerVk::Get(Uint32 ArrayIndex, Uint32 ResIndex) const
{
    const PipelineResourceDesc&      ResDesc     = GetResourceDesc(ResIndex);
    const PipelineResourceAttribsVk& Attribs     = GetResourceAttribs(ResIndex);
    const Uint32                     CacheOffset = Attribs.CacheOffset(m_ResourceCache.GetContentType());

    VERIFY_EXPR(ArrayIndex < ResDesc.ArraySize);

    if (Attribs.DescrSet < m_ResourceCache.GetNumDescriptorSets())
    {
        const ShaderResourceCacheVk::DescriptorSet& Set = const_cast<const ShaderResourceCacheVk&>(m_ResourceCache).GetDescriptorSet(Attribs.DescrSet);
        if (CacheOffset + ArrayIndex < Set.GetSize())
        {
            const ShaderResourceCacheVk::Resource& CachedRes = Set.GetResource(CacheOffset + ArrayIndex);
            return CachedRes.pObject;
        }
    }

    return nullptr;
}